

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertLight(FBXConverter *this,Light *light,string *orig_name)

{
  iterator __position;
  ulong __n;
  Type TVar1;
  Decay DVar2;
  aiLight *paVar3;
  pointer ppaVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  aiVector3D aVar8;
  aiLight *local_28;
  
  paVar3 = (aiLight *)operator_new(0x46c);
  (paVar3->mName).length = 0;
  (paVar3->mName).data[0] = '\0';
  memset((paVar3->mName).data + 1,0x1b,0x3ff);
  paVar3->mType = aiLightSource_UNDEFINED;
  (paVar3->mPosition).x = 0.0;
  (paVar3->mPosition).y = 0.0;
  (paVar3->mPosition).z = 0.0;
  (paVar3->mDirection).x = 0.0;
  (paVar3->mDirection).y = 0.0;
  *(undefined8 *)&(paVar3->mDirection).z = 0;
  (paVar3->mUp).x = 0.0;
  (paVar3->mUp).y = 0.0;
  *(undefined8 *)&(paVar3->mUp).z = 0;
  paVar3->mAttenuationLinear = 1.0;
  paVar3->mAttenuationQuadratic = 0.0;
  (paVar3->mColorDiffuse).r = 0.0;
  (paVar3->mColorDiffuse).g = 0.0;
  (paVar3->mColorDiffuse).b = 0.0;
  (paVar3->mColorSpecular).r = 0.0;
  (paVar3->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar3->mColorSpecular).b = 0;
  (paVar3->mColorAmbient).g = 0.0;
  (paVar3->mColorAmbient).b = 0.0;
  paVar3->mAngleInnerCone = 6.2831855;
  paVar3->mAngleOuterCone = 6.2831855;
  (paVar3->mSize).x = 0.0;
  (paVar3->mSize).y = 0.0;
  __position._M_current =
       (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = paVar3;
  if (__position._M_current ==
      (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*>
              ((vector<aiLight*,std::allocator<aiLight*>> *)&this->lights,__position,&local_28);
    ppaVar4 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = paVar3;
    ppaVar4 = (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
              super__Vector_impl_data._M_finish + 1;
    (this->lights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar4;
  }
  paVar3 = ppaVar4[-1];
  __n = orig_name->_M_string_length;
  if (__n < 0x400) {
    (paVar3->mName).length = (ai_uint32)__n;
    memcpy((paVar3->mName).data,(orig_name->_M_dataplus)._M_p,__n);
    (paVar3->mName).data[__n] = '\0';
  }
  fVar5 = Light::Intensity(light);
  fVar5 = fVar5 / 100.0;
  aVar8 = Light::Color(light);
  fVar6 = fVar5 * aVar8.x;
  fVar7 = fVar5 * aVar8.y;
  (paVar3->mColorDiffuse).r = fVar6;
  (paVar3->mColorDiffuse).g = fVar7;
  fVar5 = aVar8.z * fVar5;
  (paVar3->mColorDiffuse).b = fVar5;
  (paVar3->mColorSpecular).r = fVar6;
  (paVar3->mColorSpecular).g = fVar7;
  (paVar3->mColorSpecular).b = fVar5;
  (paVar3->mPosition).x = 0.0;
  (paVar3->mPosition).y = 0.0;
  *(undefined8 *)&(paVar3->mPosition).z = 0;
  (paVar3->mDirection).y = -1.0;
  (paVar3->mDirection).z = 0.0;
  (paVar3->mUp).x = 0.0;
  (paVar3->mUp).y = 0.0;
  (paVar3->mUp).z = -1.0;
  TVar1 = Light::LightType(light);
  switch(TVar1) {
  case Type_Point:
    paVar3->mType = aiLightSource_POINT;
    break;
  case Type_Directional:
    paVar3->mType = aiLightSource_DIRECTIONAL;
    break;
  case Type_Spot:
    paVar3->mType = aiLightSource_SPOT;
    fVar5 = Light::OuterAngle(light);
    paVar3->mAngleOuterCone = fVar5 * 0.017453292;
    fVar5 = Light::InnerAngle(light);
    paVar3->mAngleInnerCone = fVar5 * 0.017453292;
    break;
  case Type_Area:
    goto LAB_0016fc5b;
  case Type_Volume:
LAB_0016fc5b:
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x16fc60);
    paVar3->mType = aiLightSource_UNDEFINED;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x17e,
                  "void Assimp::FBX::FBXConverter::ConvertLight(const Light &, const std::string &)"
                 );
  }
  fVar5 = Light::DecayStart(light);
  DVar2 = Light::DecayType(light);
  switch(DVar2) {
  case Decay_None:
    paVar3->mAttenuationConstant = fVar5;
    paVar3->mAttenuationLinear = 0.0;
    break;
  case Decay_Linear:
    paVar3->mAttenuationConstant = 0.0;
    paVar3->mAttenuationLinear = 2.0 / fVar5;
    break;
  case Decay_Quadratic:
    paVar3->mAttenuationConstant = 0.0;
    paVar3->mAttenuationLinear = 0.0;
    fVar5 = 2.0 / (fVar5 * fVar5);
    goto LAB_0016fd26;
  case Decay_Cubic:
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x16fcf6);
    fVar5 = 1.0;
    goto LAB_0016fd26;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x198,
                  "void Assimp::FBX::FBXConverter::ConvertLight(const Light &, const std::string &)"
                 );
  }
  fVar5 = 0.0;
LAB_0016fd26:
  paVar3->mAttenuationQuadratic = fVar5;
  return;
}

Assistant:

void FBXConverter::ConvertLight(const Light& light, const std::string &orig_name) {
            lights.push_back(new aiLight());
            aiLight* const out_light = lights.back();

            out_light->mName.Set(orig_name);

            const float intensity = light.Intensity() / 100.0f;
            const aiVector3D& col = light.Color();

            out_light->mColorDiffuse = aiColor3D(col.x, col.y, col.z);
            out_light->mColorDiffuse.r *= intensity;
            out_light->mColorDiffuse.g *= intensity;
            out_light->mColorDiffuse.b *= intensity;

            out_light->mColorSpecular = out_light->mColorDiffuse;

            //lights are defined along negative y direction
            out_light->mPosition = aiVector3D(0.0f);
            out_light->mDirection = aiVector3D(0.0f, -1.0f, 0.0f);
            out_light->mUp = aiVector3D(0.0f, 0.0f, -1.0f);

            switch (light.LightType())
            {
            case Light::Type_Point:
                out_light->mType = aiLightSource_POINT;
                break;

            case Light::Type_Directional:
                out_light->mType = aiLightSource_DIRECTIONAL;
                break;

            case Light::Type_Spot:
                out_light->mType = aiLightSource_SPOT;
                out_light->mAngleOuterCone = AI_DEG_TO_RAD(light.OuterAngle());
                out_light->mAngleInnerCone = AI_DEG_TO_RAD(light.InnerAngle());
                break;

            case Light::Type_Area:
                FBXImporter::LogWarn("cannot represent area light, set to UNDEFINED");
                out_light->mType = aiLightSource_UNDEFINED;
                break;

            case Light::Type_Volume:
                FBXImporter::LogWarn("cannot represent volume light, set to UNDEFINED");
                out_light->mType = aiLightSource_UNDEFINED;
                break;
            default:
                ai_assert(false);
            }

            float decay = light.DecayStart();
            switch (light.DecayType())
            {
            case Light::Decay_None:
                out_light->mAttenuationConstant = decay;
                out_light->mAttenuationLinear = 0.0f;
                out_light->mAttenuationQuadratic = 0.0f;
                break;
            case Light::Decay_Linear:
                out_light->mAttenuationConstant = 0.0f;
                out_light->mAttenuationLinear = 2.0f / decay;
                out_light->mAttenuationQuadratic = 0.0f;
                break;
            case Light::Decay_Quadratic:
                out_light->mAttenuationConstant = 0.0f;
                out_light->mAttenuationLinear = 0.0f;
                out_light->mAttenuationQuadratic = 2.0f / (decay * decay);
                break;
            case Light::Decay_Cubic:
                FBXImporter::LogWarn("cannot represent cubic attenuation, set to Quadratic");
                out_light->mAttenuationQuadratic = 1.0f;
                break;
            default:
                ai_assert(false);
                break;
            }
        }